

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

void sysbvm_dwarf_debugInfo_location_constUnsigned
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t constant)

{
  size_t entryCount;
  uintptr_t local_20;
  
  if (constant < 0x20) {
    local_20 = CONCAT71(local_20._1_7_,(char)constant + '0');
  }
  else {
    if (0xff < constant) {
      if (constant < 0x10000) {
        local_20 = CONCAT71(local_20._1_7_,10);
        sysbvm_dynarray_addAll(&builder->locationExpression,1,&local_20);
        local_20 = CONCAT62(local_20._2_6_,(short)constant);
        entryCount = 2;
      }
      else if (constant >> 0x20 == 0) {
        local_20 = CONCAT71(local_20._1_7_,0xc);
        sysbvm_dynarray_addAll(&builder->locationExpression,1,&local_20);
        local_20 = CONCAT44(local_20._4_4_,(int)constant);
        entryCount = 4;
      }
      else {
        local_20 = CONCAT71(local_20._1_7_,0xe);
        sysbvm_dynarray_addAll(&builder->locationExpression,1,&local_20);
        entryCount = 8;
        local_20 = constant;
      }
      goto LAB_00157a6a;
    }
    local_20._0_1_ = 8;
    sysbvm_dynarray_addAll(&builder->locationExpression,1,&local_20);
    local_20 = CONCAT71(local_20._1_7_,(char)constant);
  }
  entryCount = 1;
LAB_00157a6a:
  sysbvm_dynarray_addAll(&builder->locationExpression,entryCount,&local_20);
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_location_constUnsigned(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t constant)
{
    if(constant <= 31)
    {
        sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_lit0 + (uint8_t)constant);
        return;
    }

    if(constant <= 0xFF)
    {
        sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_const1u);
        sysbvm_dwarf_encodeByte(&builder->locationExpression, (uint8_t)constant);
        return;
    }

    if(constant <= 0xFFFF)
    {
        sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_const2u);
        sysbvm_dwarf_encodeWord(&builder->locationExpression, (uint16_t)constant);
        return;
    }

    if(constant <= 0xFFFFFFFF)
    {
        sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_const4u);
        sysbvm_dwarf_encodeDWord(&builder->locationExpression, (uint32_t)constant);
        return;
    }

    sysbvm_dwarf_encodeByte(&builder->locationExpression, DW_OP_const8u);
    sysbvm_dwarf_encodeQWord(&builder->locationExpression, (uint64_t)constant);
}